

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OMReader.cc
# Opt level: O2

bool __thiscall
OpenMesh::IO::_OMReader_::read_binary(_OMReader_ *this,istream *_is,BaseImporter *_bi,Options *_opt)

{
  uint uVar1;
  bool bVar2;
  ChunkHeader CVar3;
  size_t sVar4;
  bool bVar5;
  size_type *local_68;
  PropertyName pn;
  
  uVar1 = _opt->flags_;
  bVar5 = Endian::local_ == 2;
  this->bytes_ = 0;
  bVar5 = bVar5 || (~uVar1 & 6) == 0;
  sVar4 = OMFormat::Header::restore(&this->header_,_is,bVar5);
  this->bytes_ = this->bytes_ + sVar4;
  pn.super_string.field_2._8_8_ = &this->property_name_;
  do {
    if (((byte)_is[*(long *)(*(long *)_is + -0x18) + 0x20] & 2) != 0) {
      return true;
    }
    sVar4 = restore<OpenMesh::IO::OMFormat::Chunk::Header>(_is,&this->chunk_header_,bVar5);
    this->bytes_ = this->bytes_ + sVar4;
    if (((byte)_is[*(long *)(*(long *)_is + -0x18) + 0x20] & 2) != 0) {
      return true;
    }
    CVar3 = this->chunk_header_;
    if (((uint)CVar3 & 2) != 0) {
      local_68 = &pn.super_string._M_string_length;
      pn.super_string._M_dataplus._M_p = (pointer)0x0;
      pn.super_string._M_string_length._0_1_ = 0;
      sVar4 = restore<OpenMesh::IO::OMFormat::Chunk::PropertyName>
                        (_is,(PropertyName *)pn.super_string.field_2._8_8_,bVar5);
      this->bytes_ = this->bytes_ + sVar4;
      std::__cxx11::string::~string((string *)&local_68);
      CVar3 = this->chunk_header_;
    }
    switch((uint)CVar3 >> 2 & 7) {
    case 0:
      bVar2 = read_binary_vertex_chunk(this,_is,_bi,_opt,bVar5);
      break;
    case 1:
      bVar2 = read_binary_mesh_chunk
                        (this,_is,_bi,(Options *)&switchD_00197ca2::switchdataD_001c4278,bVar5);
      break;
    case 2:
      bVar2 = read_binary_face_chunk(this,_is,_bi,_opt,bVar5);
      break;
    default:
      goto switchD_00197ca2_caseD_3;
    case 4:
      bVar2 = read_binary_edge_chunk
                        (this,_is,_bi,(Options *)&switchD_00197ca2::switchdataD_001c4278,bVar5);
      break;
    case 6:
      bVar2 = read_binary_halfedge_chunk
                        (this,_is,_bi,(Options *)&switchD_00197ca2::switchdataD_001c4278,bVar5);
    }
  } while (bVar2 != false);
switchD_00197ca2_caseD_3:
  return false;
}

Assistant:

bool _OMReader_::read_binary(std::istream& _is, BaseImporter& _bi, Options& _opt) const
{
  bool swap = _opt.check(Options::Swap) || (Endian::local() == Endian::MSB);

  // Initialize byte counter
  bytes_ = 0;

  bytes_ += restore(_is, header_, swap);


  while (!_is.eof()) {
    bytes_ += restore(_is, chunk_header_, swap);

    if (_is.eof())
      break;

    // Is this a named property restore the name
    if (chunk_header_.name_) {
      OMFormat::Chunk::PropertyName pn;
      bytes_ += restore(_is, property_name_, swap);
    }

    // Read in the property data. If it is an anonymous or unknown named
    // property, then skip data.
    switch (chunk_header_.entity_) {
      case OMFormat::Chunk::Entity_Vertex:
        if (!read_binary_vertex_chunk(_is, _bi, _opt, swap))
          return false;
        break;
      case OMFormat::Chunk::Entity_Face:
        if (!read_binary_face_chunk(_is, _bi, _opt, swap))
          return false;
        break;
      case OMFormat::Chunk::Entity_Edge:
        if (!read_binary_edge_chunk(_is, _bi, _opt, swap))
          return false;
        break;
      case OMFormat::Chunk::Entity_Halfedge:
        if (!read_binary_halfedge_chunk(_is, _bi, _opt, swap))
          return false;
        break;
      case OMFormat::Chunk::Entity_Mesh:
        if (!read_binary_mesh_chunk(_is, _bi, _opt, swap))
          return false;
        break;
      default:
        return false;
    }

  }

  // File was successfully parsed.
  return true;
}